

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

const_local_iterator * __thiscall
google::
dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::end(const_local_iterator *__return_storage_ptr__,
     dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
     *this,size_type i)

{
  int *piVar1;
  pointer ppVar2;
  int iVar3;
  int iVar4;
  pointer ppVar5;
  bool bVar6;
  
  ppVar5 = this->table;
  ppVar2 = ppVar5 + i + 1;
  __return_storage_ptr__->ht = this;
  __return_storage_ptr__->pos = ppVar5 + i;
  __return_storage_ptr__->end = ppVar2;
  iVar3 = (this->key_info).empty_key.first;
  iVar4 = ppVar2[-1].first;
  piVar1 = &(this->key_info).super_TransparentHasher.super_Hasher.num_compares_;
  *piVar1 = *piVar1 + 1;
  if (iVar4 + iVar3 != 0) {
    bVar6 = test_deleted(this,i);
    if (!bVar6) {
      dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::operator++(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const_local_iterator end(size_type i) const {
    const_local_iterator it = begin(i);
    if (!test_empty(i) && !test_deleted(i)) ++it;
    return it;
  }